

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O3

void __thiscall hwnet::TCPListener::Stop(TCPListener *this)

{
  Poller *this_00;
  bool bVar1;
  Ptr local_40;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_28;
  
  if (((this->started)._M_base._M_i & 1U) != 0) {
    LOCK();
    bVar1 = (this->stop)._M_base._M_i == false;
    if (bVar1) {
      (this->stop)._M_base._M_i = true;
    }
    UNLOCK();
    if (bVar1) {
      this_00 = this->poller_;
      std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPListener,void>
                ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)&local_30,
                 (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPListener>);
      local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
      if (local_30 != (element_type *)0x0) {
        local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_30->events;
      }
      local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Stack_28;
      local_30 = (element_type *)0x0;
      p_Stack_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::Remove(this_00,&local_40);
      if (local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Stack_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_28);
      }
      close(this->fd);
    }
  }
  return;
}

Assistant:

void TCPListener::Stop() {
	if(!this->started.load()) {
		return;
	}
	bool expected = false;
	if(!this->stop.compare_exchange_strong(expected,true)) {
		return;
	}
	this->poller_->Remove(shared_from_this());
	::close(this->fd);
}